

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O1

unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
* wasm::ParamUtils::getUsedParams
            (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             *__return_storage_ptr__,Function *func,Module *module)

{
  map<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_unsigned_long,_std::less<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>_>
  *pmVar1;
  size_t *psVar2;
  value_type pBVar3;
  pointer ppBVar4;
  __buckets_ptr pp_Var5;
  undefined8 *puVar6;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  _Hash_node_base *p_Var9;
  __node_base_ptr p_Var10;
  long *plVar11;
  vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *actions;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  pointer puVar12;
  pointer puVar13;
  bool bVar14;
  __node_base _Var15;
  pointer puVar16;
  size_type sVar17;
  int iVar18;
  size_t sVar19;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__s;
  __node_base_ptr p_Var20;
  __node_base_ptr p_Var21;
  long *plVar22;
  __node_ptr __node;
  pointer puVar23;
  __hash_code __code;
  Expression **extraout_RDX;
  Expression **extraout_RDX_00;
  Expression **currp;
  ulong uVar24;
  size_t sVar25;
  SetOfLocals *__bkt;
  SetOfLocals *live_00;
  SetOfLocals *extraout_RDX_01;
  SetOfLocals *live_01;
  BasicBlock *this_00;
  pointer ppBVar26;
  undefined8 *puVar27;
  BasicBlock *pBVar28;
  _Link_type __x;
  code *self;
  pointer pTVar29;
  long *plVar30;
  __node_base_ptr in_R8;
  __buckets_ptr pp_Var31;
  _Hash_node_base *p_Var32;
  __buckets_ptr pp_Var33;
  long lVar34;
  __node_base_ptr p_Var35;
  pointer __ptr_4;
  ulong uVar36;
  __hash_code __code_12;
  long lVar37;
  _Hash_node_base *p_Var38;
  pointer puVar39;
  undefined1 auStack_3d8 [8];
  ParamLiveness walker;
  value_type pBStack_e8;
  BasicBlock *curr;
  pointer local_d8;
  BasicBlock *local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  undefined1 local_a8 [8];
  unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  queue;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *usedParams;
  uint live;
  __node_base local_58;
  _Hash_node_base *p_Stack_50;
  size_type local_48;
  size_t sStack_40;
  __node_base_ptr p_Stack_38;
  
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
        super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches;
  auStack_3d8 = (undefined1  [8])0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep = (Expression **)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches._M_t.
  _M_impl._0_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches._M_t.
  _M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed._M_elems[9].currp =
       (Expression **)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currFunction = (Function *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule = (Module *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.entry =
       (BasicBlock *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.exit =
       (BasicBlock *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks.
  super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks.
  super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks.
  super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.loopTops.
  super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.loopTops.
  super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pmVar1 = &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            debugIds;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl._0_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_left =
       walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
       super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches.
       _M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  queue._M_h._M_single_bucket = (__node_base_ptr)__return_storage_ptr__;
  memset(&walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
          branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right,0,0xb2);
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>._560_8_ =
       &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks.
        _M_h._M_rehash_policy._M_next_resize;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_buckets = (__buckets_ptr)0x1;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_bucket_count = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_element_count =
       CONCAT44(walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                liveBlocks._M_h._M_element_count._4_4_,0x3f800000);
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  denseStorage.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)&walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                 copies.sparseStorage._M_h._M_rehash_policy._M_next_resize;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_rehash_policy._M_max_load_factor = 0.0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_rehash_policy._4_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_rehash_policy._M_next_resize = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_single_bucket = (__node_base_ptr)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  denseStorage.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  denseStorage.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_buckets = (__buckets_ptr)0x1;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_bucket_count = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_element_count._0_4_ = 0x3f800000;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_rehash_policy._4_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_rehash_policy._M_next_resize = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_single_bucket._0_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.N = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies._84_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.totalCopies.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.totalCopies.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.totalCopies.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 1;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)func;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currFunction = (Function *)module
  ;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pmVar1;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pmVar1;
  sVar19 = Function::getNumLocals(func);
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_node_count._0_4_ = (uint)sVar19;
  sparse_square_matrix<unsigned_char>::recreate
            ((sparse_square_matrix<unsigned_char> *)
             &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
              liveBlocks._M_h._M_single_bucket,
             (uint)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                   super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                   .debugIds._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.totalCopies.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               copies._80_8_) {
    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.totalCopies.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)walker.
                        super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                        copies._80_8_;
  }
  __x = (_Link_type)
        (ulong)(uint)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                     .
                     super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                     .debugIds._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies
              .N,(size_type)__x);
  puVar16 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            basicBlocks.
            super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar28 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.exit;
  this_00 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.exit;
  if ((BasicBlock *)
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks
      .
      super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.exit) {
    do {
      std::
      unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
      ::~unique_ptr((unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
                     *)this_00);
      this_00 = (BasicBlock *)
                &(this_00->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                 .super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    } while (this_00 != (BasicBlock *)puVar16);
    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks.
    super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar28;
  }
  std::
  _Rb_tree<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>,_std::less<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>_>
  ::_M_erase((_Rb_tree<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>,_std::less<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>_>
              *)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
                debugIds._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,__x);
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.entry =
       (BasicBlock *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.catchIndexStack
  .super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = '\0';
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pmVar1;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pmVar1;
  CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::startBasicBlock
            ((CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness> *)
             auStack_3d8);
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule =
       (Module *)
       walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
       super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.loopTops.
       super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (((long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
             super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
             super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed._M_elems
             [9].currp >> 4) +
      (long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep != 0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,
                  "void wasm::Walker<ParamLiveness, wasm::Visitor<ParamLiveness>>::walk(Expression *&) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>]"
                 );
  }
  self = CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::scan;
  Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::pushTask
            ((Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_> *)auStack_3d8,
             CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::scan,
             &func->body);
  currp = extraout_RDX;
  if (((long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
             super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
             super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed._M_elems
             [9].currp >> 4) +
      (long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep != 0) {
    do {
      if ((pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                   super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                   .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                   super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed.
                   _M_elems[9].currp ==
          walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
          super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep ==
            (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,
                        "T &wasm::SmallVector<wasm::Walker<ParamLiveness, wasm::Visitor<ParamLiveness>>::Task, 10>::back() [T = wasm::Walker<ParamLiveness, wasm::Visitor<ParamLiveness>>::Task, N = 10]"
                       );
        }
        pTVar29 = (pointer)&walker.
                            super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                            .
                            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                            .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                            super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.
                            fixed._M_elems
                            [(long)walker.
                                   super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                   .
                                   super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                                   .
                                   super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                   .super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                   .replacep + -2].currp;
      }
      else {
        pTVar29 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                  .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
                  super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
                  ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      self = (code *)pTVar29->currp;
      if ((pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                   super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                   .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                   super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed.
                   _M_elems[9].currp ==
          walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
          super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep ==
            (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x75,
                        "void wasm::SmallVector<wasm::Walker<ParamLiveness, wasm::Visitor<ParamLiveness>>::Task, 10>::pop_back() [T = wasm::Walker<ParamLiveness, wasm::Visitor<ParamLiveness>>::Task, N = 10]"
                       );
        }
        walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
        super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
        super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
        super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep =
             (Expression **)
             ((long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                    .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep + -1);
      }
      else {
        walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
        super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
        super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
        super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
             super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      auStack_3d8 = (undefined1  [8])self;
      if ((Expression *)
          (((ParamLiveness *)self)->
          super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
          super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
          super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep ==
          (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,
                      "void wasm::Walker<ParamLiveness, wasm::Visitor<ParamLiveness>>::walk(Expression *&) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>]"
                     );
      }
      (*pTVar29->func)((ParamLiveness *)auStack_3d8,(Expression **)self);
      currp = extraout_RDX_00;
    } while (((long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                    .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
                    super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                    .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed.
                    _M_elems[9].currp >> 4) +
             (long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                   super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                   .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                   super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep != 0);
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.loopTops.
      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::doEndReturn
              ((CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness> *)
               auStack_3d8,(ParamLiveness *)self,currp);
  }
  if ((char)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            catchIndexStack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage == '\x01') {
    local_a8 = (undefined1  [8])
               walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               entry;
    std::
    vector<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
    ::push_back((vector<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
                 *)&walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                    .exit,(value_type *)local_a8);
    std::
    unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
    ::~unique_ptr((unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
                   *)local_a8);
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
    __assert_fail("branches.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x255,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      ifLastBlockStack.
      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               branches._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    __assert_fail("ifLastBlockStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x256,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      loopLastBlockStack.
      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      ifLastBlockStack.
      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("loopLastBlockStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,599,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      tryLastBlockStack.
      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      loopLastBlockStack.
      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("tryLastBlockStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,600,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      throwingInstsStack.
      super__Vector_base<std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               tryLastBlockStack.
               super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("throwingInstsStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x259,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  if ((pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               tryStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_start !=
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      throwingInstsStack.
      super__Vector_base<std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("tryStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x25a,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      processCatchStack.
      super__Vector_base<std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               tryStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("processCatchStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x25b,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  usedParams = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)&p_Stack_38;
  _live = (__buckets_ptr)0x1;
  local_58._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_50 = (_Hash_node_base *)0x0;
  local_48 = CONCAT44(local_48._4_4_,0x3f800000);
  sStack_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  local_a8 = (undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize;
  queue._M_h._M_buckets = (__buckets_ptr)0x1;
  queue._M_h._M_bucket_count = 0;
  queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  queue._M_h._M_element_count._0_4_ = 0x3f800000;
  queue._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  queue._M_h._M_rehash_policy._4_4_ = 0;
  queue._M_h._M_rehash_policy._M_next_resize = 0;
  std::
  unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  ::insert((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
            *)local_a8,
           (value_type *)
           &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule);
  puVar27 = (undefined8 *)queue._M_h._M_bucket_count;
  if (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    do {
      pBVar3 = *(value_type *)(queue._M_h._M_bucket_count + 8);
      pBStack_e8 = pBVar3;
      std::
      unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ::erase((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
               *)local_a8,(iterator)queue._M_h._M_bucket_count);
      std::
      unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ::insert((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                *)&usedParams,&stack0xffffffffffffff18);
      ppBVar4 = (pBVar3->out).
                super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppBVar26 = (pBVar3->out).
                      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppBVar26 != ppBVar4;
          ppBVar26 = ppBVar26 + 1) {
        local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*ppBVar26;
        pp_Var5 = (&(usedParams->_M_h)._M_buckets)
                  [(ulong)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start % (ulong)_live];
        p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
        if ((pp_Var5 != (__buckets_ptr)0x0) &&
           (p_Var21 = (__node_base_ptr)pp_Var5, p_Var20 = *pp_Var5,
           (value_type)
           local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start != (value_type)(*pp_Var5)[1]._M_nxt)) {
          while (p_Var35 = p_Var20->_M_nxt, p_Var35 != (__node_base_ptr)0x0) {
            p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
            if (((ulong)p_Var35[1]._M_nxt % (ulong)_live !=
                 (ulong)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start % (ulong)_live) ||
               (p_Var21 = p_Var20, p_Var20 = p_Var35,
               (value_type)
               local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start == (value_type)p_Var35[1]._M_nxt))
            goto LAB_0077aea5;
          }
          p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
        }
LAB_0077aea5:
        in_R8 = (__node_base_ptr)_live;
        if ((p_Var21 == (__node_base_ptr)0x0) || (p_Var21->_M_nxt == (__node_base_ptr)0x0)) {
          std::
          unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
          ::insert((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                    *)local_a8,(value_type *)&local_c8);
        }
      }
      puVar27 = (undefined8 *)queue._M_h._M_bucket_count;
    } while (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0);
  }
  while (puVar27 != (undefined8 *)0x0) {
    puVar6 = (undefined8 *)*puVar27;
    operator_delete(puVar27,0x10);
    puVar27 = puVar6;
  }
  memset((void *)local_a8,0,(long)queue._M_h._M_buckets << 3);
  queue._M_h._M_bucket_count = 0;
  queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  psVar2 = &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            liveBlocks._M_h._M_rehash_policy._M_next_resize;
  puVar27 = (undefined8 *)
            walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            liveBlocks._M_h._M_bucket_count;
  if ((undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize != local_a8) {
    operator_delete((void *)local_a8,(long)queue._M_h._M_buckets << 3);
    puVar27 = (undefined8 *)
              walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
              liveBlocks._M_h._M_bucket_count;
  }
  while (puVar27 != (undefined8 *)0x0) {
    puVar6 = (undefined8 *)*puVar27;
    operator_delete(puVar27,0x10);
    puVar27 = puVar6;
  }
  if (psVar2 != (size_t *)
                walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                _560_8_) {
    operator_delete((void *)walker.
                            super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                            ._560_8_,
                    (long)walker.
                          super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                          liveBlocks._M_h._M_buckets << 3);
  }
  pp_Var31 = _live;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_element_count = local_48;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_rehash_policy._0_8_ = sStack_40;
  if ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       *)&p_Stack_38 == usedParams) {
    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
    _M_rehash_policy._M_next_resize = (size_t)p_Stack_38;
    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>._560_8_ = psVar2
    ;
  }
  else {
    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>._560_8_ =
         usedParams;
  }
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_buckets = _live;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_bucket_count = (size_type)local_58._M_nxt;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_before_begin._M_nxt = p_Stack_50;
  if (local_58._M_nxt != (_Hash_node_base *)0x0) {
    *(size_type **)
     (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>._560_8_ +
     ((ulong)local_58._M_nxt[1]._M_nxt % (ulong)_live) * 8) =
         &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks
          ._M_h._M_bucket_count;
  }
  usedParams = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)0x0;
  local_58._M_nxt = (__node_base_ptr)0x0;
  p_Stack_38 = (__node_base_ptr)0x0;
  if (_live == (__buckets_ptr)0x1) {
    p_Stack_38 = (__node_base_ptr)0x0;
    __s = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           *)&p_Stack_38;
  }
  else {
    __s = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           *)__gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                       ((new_allocator<std::__detail::_Hash_node_base_*> *)local_a8,(size_type)_live
                        ,(void *)0x0);
    memset(__s,0,(long)pp_Var31 << 3);
  }
  sVar17 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
           liveBlocks._M_h._M_bucket_count;
  usedParams = __s;
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks.
      _M_h._M_bucket_count != 0) {
    local_58._M_nxt = (_Hash_node_base *)operator_new(0x10);
    (local_58._M_nxt)->_M_nxt = (_Hash_node_base *)0x0;
    p_Var7 = *(_Hash_node_base **)(sVar17 + 8);
    local_58._M_nxt[1]._M_nxt = p_Var7;
    (&(usedParams->_M_h)._M_buckets)[(ulong)p_Var7 % (ulong)_live] = &local_58._M_nxt;
    p_Var21 = local_58._M_nxt;
    for (puVar27 = *(undefined8 **)sVar17; puVar27 != (undefined8 *)0x0;
        puVar27 = (undefined8 *)*puVar27) {
      p_Var20 = (__node_base_ptr)operator_new(0x10);
      p_Var20->_M_nxt = (_Hash_node_base *)0x0;
      p_Var20[1]._M_nxt = (_Hash_node_base *)puVar27[1];
      p_Var21->_M_nxt = p_Var20;
      uVar24 = (ulong)p_Var20[1]._M_nxt % (ulong)_live;
      if ((&(usedParams->_M_h)._M_buckets)[uVar24] == (__buckets_ptr)0x0) {
        (&(usedParams->_M_h)._M_buckets)[uVar24] = &p_Var21->_M_nxt;
      }
      p_Var21 = p_Var20;
    }
  }
  walker._736_8_ =
       walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
       super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
       basicBlocks.
       super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pBVar28 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.exit;
  _Var15._M_nxt = local_58._M_nxt;
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.exit !=
      (BasicBlock *)
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks
      .
      super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      p_Var7 = (_Hash_node_base *)
               (pBVar28->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pp_Var5 = (&(usedParams->_M_h)._M_buckets)[(ulong)p_Var7 % (ulong)_live];
      p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
      if ((pp_Var5 != (__buckets_ptr)0x0) &&
         (p_Var21 = (__node_base_ptr)pp_Var5, p_Var20 = *pp_Var5, p_Var7 != (*pp_Var5)[1]._M_nxt)) {
        while (p_Var35 = p_Var20->_M_nxt, p_Var35 != (__node_base_ptr)0x0) {
          p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
          if (((ulong)p_Var35[1]._M_nxt % (ulong)_live != (ulong)p_Var7 % (ulong)_live) ||
             (p_Var21 = p_Var20, p_Var20 = p_Var35, p_Var7 == p_Var35[1]._M_nxt)) goto LAB_0077b16f;
        }
        p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
      }
LAB_0077b16f:
      if ((p_Var21 == (__node_base_ptr)0x0) || (p_Var21->_M_nxt == (__node_base_ptr)0x0)) {
        if (p_Var7[0xd]._M_nxt != p_Var7[0xc]._M_nxt) {
          p_Var7[0xd]._M_nxt = p_Var7[0xc]._M_nxt;
        }
        lVar37 = (long)(pBVar28->contents).start.
                       super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        in_R8 = (__node_base_ptr)_live;
        if (*(long *)(lVar37 + 0x50) != *(long *)(lVar37 + 0x48)) {
          *(long *)(lVar37 + 0x50) = *(long *)(lVar37 + 0x48);
        }
      }
      else {
        p_Var38 = p_Var7[0xc]._M_nxt;
        p_Var8 = p_Var7[0xd]._M_nxt;
        lVar37 = (long)p_Var8 - (long)p_Var38 >> 5;
        p_Var32 = p_Var38;
        if (0 < lVar37) {
          p_Var32 = (_Hash_node_base *)
                    ((long)&p_Var38->_M_nxt + ((long)p_Var8 - (long)p_Var38 & 0xffffffffffffffe0U));
          do {
            p_Var9 = p_Var38->_M_nxt;
            pp_Var5 = (&(usedParams->_M_h)._M_buckets)[(ulong)p_Var9 % (ulong)_live];
            p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
            if ((pp_Var5 != (__buckets_ptr)0x0) &&
               (p_Var21 = (__node_base_ptr)pp_Var5, p_Var20 = *pp_Var5,
               p_Var9 != (*pp_Var5)[1]._M_nxt)) {
              while (p_Var35 = p_Var20->_M_nxt, p_Var35 != (__node_base_ptr)0x0) {
                p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
                if (((ulong)p_Var35[1]._M_nxt % (ulong)_live != (ulong)p_Var9 % (ulong)_live) ||
                   (p_Var21 = p_Var20, p_Var20 = p_Var35, p_Var9 == p_Var35[1]._M_nxt))
                goto LAB_0077b206;
              }
              p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
            }
LAB_0077b206:
            if ((p_Var21 == (__node_base_ptr)0x0) || (p_Var21->_M_nxt == (__node_base_ptr)0x0))
            goto LAB_0077b518;
            p_Var9 = p_Var38[1]._M_nxt;
            pp_Var5 = (&(usedParams->_M_h)._M_buckets)[(ulong)p_Var9 % (ulong)_live];
            p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
            if ((pp_Var5 != (__buckets_ptr)0x0) &&
               (p_Var21 = (__node_base_ptr)pp_Var5, p_Var20 = *pp_Var5,
               p_Var9 != (*pp_Var5)[1]._M_nxt)) {
              while (p_Var35 = p_Var20->_M_nxt, p_Var35 != (__node_base_ptr)0x0) {
                p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
                if (((ulong)p_Var35[1]._M_nxt % (ulong)_live != (ulong)p_Var9 % (ulong)_live) ||
                   (p_Var21 = p_Var20, p_Var20 = p_Var35, p_Var9 == p_Var35[1]._M_nxt))
                goto LAB_0077b272;
              }
              p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
            }
LAB_0077b272:
            if ((p_Var21 == (__node_base_ptr)0x0) || (p_Var21->_M_nxt == (__node_base_ptr)0x0)) {
              p_Var38 = p_Var38 + 1;
              goto LAB_0077b518;
            }
            p_Var9 = p_Var38[2]._M_nxt;
            pp_Var5 = (&(usedParams->_M_h)._M_buckets)[(ulong)p_Var9 % (ulong)_live];
            p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
            if ((pp_Var5 != (__buckets_ptr)0x0) &&
               (p_Var21 = (__node_base_ptr)pp_Var5, p_Var20 = *pp_Var5,
               p_Var9 != (*pp_Var5)[1]._M_nxt)) {
              while (p_Var35 = p_Var20->_M_nxt, p_Var35 != (__node_base_ptr)0x0) {
                p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
                if (((ulong)p_Var35[1]._M_nxt % (ulong)_live != (ulong)p_Var9 % (ulong)_live) ||
                   (p_Var21 = p_Var20, p_Var20 = p_Var35, p_Var9 == p_Var35[1]._M_nxt))
                goto LAB_0077b2de;
              }
              p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
            }
LAB_0077b2de:
            if ((p_Var21 == (__node_base_ptr)0x0) || (p_Var21->_M_nxt == (__node_base_ptr)0x0)) {
              p_Var38 = p_Var38 + 2;
              goto LAB_0077b518;
            }
            p_Var9 = p_Var38[3]._M_nxt;
            pp_Var5 = (&(usedParams->_M_h)._M_buckets)[(ulong)p_Var9 % (ulong)_live];
            p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
            if ((pp_Var5 != (__buckets_ptr)0x0) &&
               (p_Var21 = (__node_base_ptr)pp_Var5, p_Var20 = *pp_Var5,
               p_Var9 != (*pp_Var5)[1]._M_nxt)) {
              while (p_Var35 = p_Var20->_M_nxt, p_Var35 != (__node_base_ptr)0x0) {
                p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
                if (((ulong)p_Var35[1]._M_nxt % (ulong)_live != (ulong)p_Var9 % (ulong)_live) ||
                   (p_Var21 = p_Var20, p_Var20 = p_Var35, p_Var9 == p_Var35[1]._M_nxt))
                goto LAB_0077b34a;
              }
              p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
            }
LAB_0077b34a:
            if ((p_Var21 == (__node_base_ptr)0x0) || (p_Var21->_M_nxt == (__node_base_ptr)0x0)) {
              p_Var38 = p_Var38 + 3;
              goto LAB_0077b518;
            }
            p_Var38 = p_Var38 + 4;
            bVar14 = 1 < lVar37;
            lVar37 = lVar37 + -1;
          } while (bVar14);
        }
        lVar37 = (long)p_Var8 - (long)p_Var32 >> 3;
        if (lVar37 == 1) {
LAB_0077b4b3:
          p_Var38 = p_Var32->_M_nxt;
          pp_Var5 = (&(usedParams->_M_h)._M_buckets)[(ulong)p_Var38 % (ulong)_live];
          p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
          if ((pp_Var5 != (__buckets_ptr)0x0) &&
             (p_Var21 = (__node_base_ptr)pp_Var5, p_Var20 = *pp_Var5,
             p_Var38 != (*pp_Var5)[1]._M_nxt)) {
            while (p_Var35 = p_Var20->_M_nxt, p_Var35 != (__node_base_ptr)0x0) {
              p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
              if (((ulong)p_Var35[1]._M_nxt % (ulong)_live != (ulong)p_Var38 % (ulong)_live) ||
                 (p_Var21 = p_Var20, p_Var20 = p_Var35, p_Var38 == p_Var35[1]._M_nxt))
              goto LAB_0077b508;
            }
            p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
          }
LAB_0077b508:
          p_Var38 = p_Var32;
          if ((p_Var21 != (__node_base_ptr)0x0) && (p_Var21->_M_nxt != (__node_base_ptr)0x0)) {
            p_Var38 = p_Var8;
          }
        }
        else if (lVar37 == 2) {
LAB_0077b44f:
          p_Var38 = p_Var32->_M_nxt;
          pp_Var5 = (&(usedParams->_M_h)._M_buckets)[(ulong)p_Var38 % (ulong)_live];
          p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
          if ((pp_Var5 != (__buckets_ptr)0x0) &&
             (p_Var21 = (__node_base_ptr)pp_Var5, p_Var20 = *pp_Var5,
             p_Var38 != (*pp_Var5)[1]._M_nxt)) {
            while (p_Var35 = p_Var20->_M_nxt, p_Var35 != (__node_base_ptr)0x0) {
              p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
              if (((ulong)p_Var35[1]._M_nxt % (ulong)_live != (ulong)p_Var38 % (ulong)_live) ||
                 (p_Var21 = p_Var20, p_Var20 = p_Var35, p_Var38 == p_Var35[1]._M_nxt))
              goto LAB_0077b4a4;
            }
            p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
          }
LAB_0077b4a4:
          p_Var38 = p_Var32;
          if ((p_Var21 != (__node_base_ptr)0x0) && (p_Var21->_M_nxt != (__node_base_ptr)0x0)) {
            p_Var32 = p_Var32 + 1;
            goto LAB_0077b4b3;
          }
        }
        else {
          p_Var38 = p_Var8;
          if (lVar37 == 3) {
            p_Var38 = p_Var32->_M_nxt;
            pp_Var5 = (&(usedParams->_M_h)._M_buckets)[(ulong)p_Var38 % (ulong)_live];
            p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
            if ((pp_Var5 != (__buckets_ptr)0x0) &&
               (p_Var21 = (__node_base_ptr)pp_Var5, p_Var20 = *pp_Var5,
               p_Var38 != (*pp_Var5)[1]._M_nxt)) {
              while (p_Var35 = p_Var20->_M_nxt, p_Var35 != (__node_base_ptr)0x0) {
                p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
                if (((ulong)p_Var35[1]._M_nxt % (ulong)_live != (ulong)p_Var38 % (ulong)_live) ||
                   (p_Var21 = p_Var20, p_Var20 = p_Var35, p_Var38 == p_Var35[1]._M_nxt))
                goto LAB_0077b438;
              }
              p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
            }
LAB_0077b438:
            p_Var38 = p_Var32;
            if ((p_Var21 != (__node_base_ptr)0x0) && (p_Var21->_M_nxt != (__node_base_ptr)0x0)) {
              p_Var32 = p_Var32 + 1;
              goto LAB_0077b44f;
            }
          }
        }
LAB_0077b518:
        p_Var32 = p_Var38 + 1;
        if (p_Var32 != p_Var8 && p_Var38 != p_Var8) {
          do {
            p_Var9 = p_Var32->_M_nxt;
            pp_Var5 = (&(usedParams->_M_h)._M_buckets)[(ulong)p_Var9 % (ulong)_live];
            p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
            if ((pp_Var5 != (__buckets_ptr)0x0) &&
               (p_Var20 = *pp_Var5, p_Var21 = (__node_base_ptr)pp_Var5, p_Var9 != p_Var20[1]._M_nxt)
               ) {
              while (p_Var35 = p_Var20->_M_nxt, p_Var35 != (__node_base_ptr)0x0) {
                p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
                if (((ulong)p_Var35[1]._M_nxt % (ulong)_live != (ulong)p_Var9 % (ulong)_live) ||
                   (p_Var21 = p_Var20, p_Var20 = p_Var35, p_Var9 == p_Var35[1]._M_nxt))
                goto LAB_0077b589;
              }
              p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
            }
LAB_0077b589:
            if ((p_Var21 != (__node_base_ptr)0x0) && (p_Var21->_M_nxt != (__node_base_ptr)0x0)) {
              p_Var38->_M_nxt = p_Var9;
              p_Var38 = p_Var38 + 1;
            }
            p_Var32 = p_Var32 + 1;
          } while (p_Var32 != p_Var8);
        }
        p_Var8 = *(_Hash_node_base **)
                  ((long)(pBVar28->contents).start.
                         super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x68);
        local_d0 = pBVar28;
        if (p_Var38 != p_Var8) {
          sVar25 = (long)p_Var7[0xd]._M_nxt - (long)p_Var8;
          if (sVar25 != 0) {
            memmove(p_Var38,p_Var8,sVar25);
          }
          p_Var38 = (_Hash_node_base *)((long)p_Var38 + ((long)p_Var7[0xd]._M_nxt - (long)p_Var8));
          if (p_Var7[0xd]._M_nxt != p_Var38) {
            p_Var7[0xd]._M_nxt = p_Var38;
          }
        }
        lVar37 = (long)(local_d0->contents).start.
                       super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        pp_Var31 = *(__buckets_ptr *)(lVar37 + 0x48);
        in_R8 = *(__node_base_ptr *)(lVar37 + 0x50);
        lVar34 = (long)in_R8 - (long)pp_Var31 >> 5;
        pp_Var33 = pp_Var31;
        if (0 < lVar34) {
          pp_Var33 = (__buckets_ptr)
                     (((long)in_R8 - (long)pp_Var31 & 0xffffffffffffffe0U) + (long)pp_Var31);
          do {
            p_Var21 = *pp_Var31;
            pp_Var5 = (&(usedParams->_M_h)._M_buckets)[(ulong)p_Var21 % (ulong)_live];
            p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
            if ((pp_Var5 != (__buckets_ptr)0x0) &&
               (p_Var20 = (__node_base_ptr)pp_Var5, p_Var35 = *pp_Var5,
               p_Var21 != (*pp_Var5)[1]._M_nxt)) {
              while (p_Var10 = p_Var35->_M_nxt, p_Var10 != (__node_base_ptr)0x0) {
                p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
                if (((ulong)p_Var10[1]._M_nxt % (ulong)_live != (ulong)p_Var21 % (ulong)_live) ||
                   (p_Var20 = p_Var35, p_Var35 = p_Var10, p_Var21 == p_Var10[1]._M_nxt))
                goto LAB_0077b670;
              }
              p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
            }
LAB_0077b670:
            if ((p_Var20 == (__node_base_ptr)0x0) || (p_Var20->_M_nxt == (__node_base_ptr)0x0))
            goto LAB_0077b972;
            p_Var21 = pp_Var31[1];
            pp_Var5 = (&(usedParams->_M_h)._M_buckets)[(ulong)p_Var21 % (ulong)_live];
            p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
            if ((pp_Var5 != (__buckets_ptr)0x0) &&
               (p_Var20 = (__node_base_ptr)pp_Var5, p_Var35 = *pp_Var5,
               p_Var21 != (*pp_Var5)[1]._M_nxt)) {
              while (p_Var10 = p_Var35->_M_nxt, p_Var10 != (__node_base_ptr)0x0) {
                p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
                if (((ulong)p_Var10[1]._M_nxt % (ulong)_live != (ulong)p_Var21 % (ulong)_live) ||
                   (p_Var20 = p_Var35, p_Var35 = p_Var10, p_Var21 == p_Var10[1]._M_nxt))
                goto LAB_0077b6dc;
              }
              p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
            }
LAB_0077b6dc:
            if ((p_Var20 == (__node_base_ptr)0x0) || (p_Var20->_M_nxt == (__node_base_ptr)0x0)) {
              pp_Var31 = pp_Var31 + 1;
              goto LAB_0077b972;
            }
            p_Var21 = pp_Var31[2];
            pp_Var5 = (&(usedParams->_M_h)._M_buckets)[(ulong)p_Var21 % (ulong)_live];
            p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
            if ((pp_Var5 != (__buckets_ptr)0x0) &&
               (p_Var20 = (__node_base_ptr)pp_Var5, p_Var35 = *pp_Var5,
               p_Var21 != (*pp_Var5)[1]._M_nxt)) {
              while (p_Var10 = p_Var35->_M_nxt, p_Var10 != (__node_base_ptr)0x0) {
                p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
                if (((ulong)p_Var10[1]._M_nxt % (ulong)_live != (ulong)p_Var21 % (ulong)_live) ||
                   (p_Var20 = p_Var35, p_Var35 = p_Var10, p_Var21 == p_Var10[1]._M_nxt))
                goto LAB_0077b748;
              }
              p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
            }
LAB_0077b748:
            if ((p_Var20 == (__node_base_ptr)0x0) || (p_Var20->_M_nxt == (__node_base_ptr)0x0)) {
              pp_Var31 = pp_Var31 + 2;
              goto LAB_0077b972;
            }
            p_Var21 = pp_Var31[3];
            pp_Var5 = (&(usedParams->_M_h)._M_buckets)[(ulong)p_Var21 % (ulong)_live];
            p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
            if ((pp_Var5 != (__buckets_ptr)0x0) &&
               (p_Var20 = (__node_base_ptr)pp_Var5, p_Var35 = *pp_Var5,
               p_Var21 != (*pp_Var5)[1]._M_nxt)) {
              while (p_Var10 = p_Var35->_M_nxt, p_Var10 != (__node_base_ptr)0x0) {
                p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
                if (((ulong)p_Var10[1]._M_nxt % (ulong)_live != (ulong)p_Var21 % (ulong)_live) ||
                   (p_Var20 = p_Var35, p_Var35 = p_Var10, p_Var21 == p_Var10[1]._M_nxt))
                goto LAB_0077b7b4;
              }
              p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
            }
LAB_0077b7b4:
            if ((p_Var20 == (__node_base_ptr)0x0) || (p_Var20->_M_nxt == (__node_base_ptr)0x0)) {
              pp_Var31 = pp_Var31 + 3;
              goto LAB_0077b972;
            }
            pp_Var31 = pp_Var31 + 4;
            bVar14 = 1 < lVar34;
            lVar34 = lVar34 + -1;
          } while (bVar14);
        }
        lVar34 = (long)in_R8 - (long)pp_Var33 >> 3;
        if (lVar34 == 1) {
LAB_0077b905:
          p_Var21 = *pp_Var33;
          pp_Var5 = (&(usedParams->_M_h)._M_buckets)[(ulong)p_Var21 % (ulong)_live];
          p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
          if ((pp_Var5 != (__buckets_ptr)0x0) &&
             (p_Var20 = (__node_base_ptr)pp_Var5, p_Var35 = *pp_Var5,
             p_Var21 != (*pp_Var5)[1]._M_nxt)) {
            while (p_Var10 = p_Var35->_M_nxt, p_Var10 != (__node_base_ptr)0x0) {
              p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
              if (((ulong)p_Var10[1]._M_nxt % (ulong)_live != (ulong)p_Var21 % (ulong)_live) ||
                 (p_Var20 = p_Var35, p_Var35 = p_Var10, p_Var21 == p_Var10[1]._M_nxt))
              goto LAB_0077b962;
            }
            p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
          }
LAB_0077b962:
          pp_Var31 = pp_Var33;
          if ((p_Var20 != (__node_base_ptr)0x0) && (p_Var20->_M_nxt != (__node_base_ptr)0x0)) {
            pp_Var31 = &in_R8->_M_nxt;
          }
        }
        else if (lVar34 == 2) {
LAB_0077b899:
          p_Var21 = *pp_Var33;
          pp_Var5 = (&(usedParams->_M_h)._M_buckets)[(ulong)p_Var21 % (ulong)_live];
          p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
          if ((pp_Var5 != (__buckets_ptr)0x0) &&
             (p_Var20 = (__node_base_ptr)pp_Var5, p_Var35 = *pp_Var5,
             p_Var21 != (*pp_Var5)[1]._M_nxt)) {
            while (p_Var10 = p_Var35->_M_nxt, p_Var10 != (__node_base_ptr)0x0) {
              p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
              if (((ulong)p_Var10[1]._M_nxt % (ulong)_live != (ulong)p_Var21 % (ulong)_live) ||
                 (p_Var20 = p_Var35, p_Var35 = p_Var10, p_Var21 == p_Var10[1]._M_nxt))
              goto LAB_0077b8f6;
            }
            p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
          }
LAB_0077b8f6:
          pp_Var31 = pp_Var33;
          if ((p_Var20 != (__node_base_ptr)0x0) && (p_Var20->_M_nxt != (__node_base_ptr)0x0)) {
            pp_Var33 = pp_Var33 + 1;
            goto LAB_0077b905;
          }
        }
        else {
          pp_Var31 = &in_R8->_M_nxt;
          if (lVar34 == 3) {
            p_Var21 = *pp_Var33;
            pp_Var5 = (&(usedParams->_M_h)._M_buckets)[(ulong)p_Var21 % (ulong)_live];
            p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
            if ((pp_Var5 != (__buckets_ptr)0x0) &&
               (p_Var20 = (__node_base_ptr)pp_Var5, p_Var35 = *pp_Var5,
               p_Var21 != (*pp_Var5)[1]._M_nxt)) {
              while (p_Var10 = p_Var35->_M_nxt, p_Var10 != (__node_base_ptr)0x0) {
                p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
                if (((ulong)p_Var10[1]._M_nxt % (ulong)_live != (ulong)p_Var21 % (ulong)_live) ||
                   (p_Var20 = p_Var35, p_Var35 = p_Var10, p_Var21 == p_Var10[1]._M_nxt))
                goto LAB_0077b882;
              }
              p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
            }
LAB_0077b882:
            pp_Var31 = pp_Var33;
            if ((p_Var20 != (__node_base_ptr)0x0) && (p_Var20->_M_nxt != (__node_base_ptr)0x0)) {
              pp_Var33 = pp_Var33 + 1;
              goto LAB_0077b899;
            }
          }
        }
LAB_0077b972:
        pp_Var33 = pp_Var31;
        if ((__node_base_ptr)pp_Var31 != in_R8) {
          while (pp_Var33 = pp_Var33 + 1, (__node_base_ptr)pp_Var33 != in_R8) {
            p_Var21 = *pp_Var33;
            pp_Var5 = (&(usedParams->_M_h)._M_buckets)[(ulong)p_Var21 % (ulong)_live];
            p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
            if ((pp_Var5 != (__buckets_ptr)0x0) &&
               (p_Var35 = *pp_Var5, p_Var20 = (__node_base_ptr)pp_Var5, p_Var21 != p_Var35[1]._M_nxt
               )) {
              while (p_Var10 = p_Var35->_M_nxt, p_Var10 != (__node_base_ptr)0x0) {
                p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
                if (((ulong)p_Var10[1]._M_nxt % (ulong)_live != (ulong)p_Var21 % (ulong)_live) ||
                   (p_Var20 = p_Var35, p_Var35 = p_Var10, p_Var21 == p_Var10[1]._M_nxt))
                goto LAB_0077b9e5;
              }
              p_Var20 = (__node_base_ptr)(__buckets_ptr)0x0;
            }
LAB_0077b9e5:
            if ((p_Var20 != (__node_base_ptr)0x0) && (p_Var20->_M_nxt != (__node_base_ptr)0x0)) {
              *pp_Var31 = p_Var21;
              pp_Var31 = pp_Var31 + 1;
            }
          }
        }
        pp_Var33 = *(__buckets_ptr *)
                    ((long)(local_d0->contents).start.
                           super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + 0x50);
        pBVar28 = local_d0;
        if (pp_Var31 != pp_Var33) {
          sVar25 = *(long *)(lVar37 + 0x50) - (long)pp_Var33;
          if (sVar25 != 0) {
            memmove(pp_Var31,pp_Var33,sVar25);
          }
          lVar34 = (long)pp_Var31 + (*(long *)(lVar37 + 0x50) - (long)pp_Var33);
          pBVar28 = local_d0;
          if (*(long *)(lVar37 + 0x50) != lVar34) {
            *(long *)(lVar37 + 0x50) = lVar34;
          }
        }
      }
      pBVar28 = (BasicBlock *)
                &(pBVar28->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                 .super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      _Var15._M_nxt = local_58._M_nxt;
    } while (pBVar28 != (BasicBlock *)walker._736_8_);
  }
  while (_Var15._M_nxt != (__node_base_ptr)0x0) {
    p_Var7 = (_Var15._M_nxt)->_M_nxt;
    operator_delete(_Var15._M_nxt,0x10);
    _Var15._M_nxt = p_Var7;
  }
  memset(usedParams,0,(long)_live << 3);
  local_58._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_50 = (_Hash_node_base *)0x0;
  if ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       *)&p_Stack_38 != usedParams) {
    operator_delete(usedParams,(long)_live << 3);
  }
  puVar16 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            basicBlocks.
            super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize;
  queue._M_h._M_buckets = (__buckets_ptr)0x1;
  queue._M_h._M_bucket_count = 0;
  queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  queue._M_h._M_element_count._0_4_ = 0x3f800000;
  queue._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  queue._M_h._M_rehash_policy._4_4_ = 0;
  queue._M_h._M_rehash_policy._M_next_resize = 0;
  pBVar28 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.exit;
  do {
    if (pBVar28 == (BasicBlock *)puVar16) {
      puVar27 = (undefined8 *)queue._M_h._M_bucket_count;
      if (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        do {
          this = *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                  (queue._M_h._M_bucket_count + 8);
          std::
          unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
          ::erase((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   *)local_a8,(iterator)queue._M_h._M_bucket_count);
          local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          puVar23 = this[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (this[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish != puVar23) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      (&local_c8,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)puVar23);
            puVar23 = this[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (8 < (ulong)((long)this[3].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar23)) {
              uVar24 = 1;
              uVar36 = 2;
              do {
                SortedVector::merge((SortedVector *)&stack0xffffffffffffff18,
                                    (SortedVector *)&local_c8,
                                    *(SortedVector **)(puVar23 + uVar24 * 2));
                puVar12 = local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
                puVar23 = local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)pBStack_e8;
                local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)curr;
                local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = local_d8;
                pBStack_e8 = (value_type)0x0;
                curr = (BasicBlock *)0x0;
                local_d8 = (pointer)0x0;
                if ((value_type)puVar23 != (value_type)0x0) {
                  operator_delete(puVar23,(long)puVar12 - (long)puVar23);
                }
                if (pBStack_e8 != (value_type)0x0) {
                  operator_delete(pBStack_e8,(long)local_d8 - (long)pBStack_e8);
                }
                puVar23 = this[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                bVar14 = uVar36 < (ulong)((long)this[3].
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)puVar23 >> 3);
                uVar24 = uVar36;
                uVar36 = (ulong)((int)uVar36 + 1);
              } while (bVar14);
            }
            puVar23 = this[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            puVar12 = this[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            uVar24 = (long)puVar12 - (long)puVar23;
            uVar36 = (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
            if ((uVar24 != uVar36) ||
               ((puVar12 != puVar23 &&
                (iVar18 = bcmp(puVar23,local_c8.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start,uVar24),
                iVar18 != 0)))) {
              if (uVar36 <= uVar24) {
                __assert_fail("curr->contents.end.size() < live.size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/liveness-traversal.h"
                              ,0xf4,
                              "void wasm::LivenessWalker<ParamLiveness, wasm::Visitor<ParamLiveness>>::flowLiveness() [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>]"
                             );
              }
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (this + 1,&local_c8);
              LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::
              scanLivenessThroughActions
                        ((LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_> *)
                         (this + 2),
                         (vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *)
                         &local_c8,live_01);
              puVar23 = (this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              puVar12 = (this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
              uVar24 = (long)puVar12 - (long)puVar23;
              uVar36 = (long)local_c8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)local_c8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
              if ((uVar24 != uVar36) ||
                 ((puVar12 != puVar23 &&
                  (iVar18 = bcmp(puVar23,local_c8.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start,uVar24),
                  iVar18 != 0)))) {
                if (uVar36 <= uVar24) {
                  __assert_fail("curr->contents.start.size() < live.size()",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/liveness-traversal.h"
                                ,0xfc,
                                "void wasm::LivenessWalker<ParamLiveness, wasm::Visitor<ParamLiveness>>::flowLiveness() [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>]"
                               );
                }
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(this,&local_c8);
                puVar12 = this[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                for (puVar23 = this[4].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start; puVar23 != puVar12;
                    puVar23 = puVar23 + 2) {
                  pBStack_e8 = *(value_type *)puVar23;
                  std::
                  unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                  ::insert((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            *)local_a8,&stack0xffffffffffffff18);
                }
              }
            }
          }
          if ((value_type)
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (value_type)0x0) {
            operator_delete(local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_c8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_c8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          puVar27 = (undefined8 *)queue._M_h._M_bucket_count;
        } while (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0);
      }
      while (puVar27 != (undefined8 *)0x0) {
        puVar6 = (undefined8 *)*puVar27;
        operator_delete(puVar27,0x10);
        puVar27 = puVar6;
      }
      memset((void *)local_a8,0,(long)queue._M_h._M_buckets << 3);
      queue._M_h._M_bucket_count = 0;
      queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if ((undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize != local_a8) {
        operator_delete((void *)local_a8,(long)queue._M_h._M_buckets << 3);
      }
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
          super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule ==
          (Module *)0x0) {
        (queue._M_h._M_single_bucket)->_M_nxt = (_Hash_node_base *)0x0;
        queue._M_h._M_single_bucket[1]._M_nxt = (_Hash_node_base *)0x0;
        queue._M_h._M_single_bucket[4]._M_nxt = (_Hash_node_base *)0x0;
        queue._M_h._M_single_bucket[5]._M_nxt = (_Hash_node_base *)0x0;
        queue._M_h._M_single_bucket[2]._M_nxt = (_Hash_node_base *)0x0;
        queue._M_h._M_single_bucket[3]._M_nxt = (_Hash_node_base *)0x0;
        queue._M_h._M_single_bucket[6]._M_nxt = (_Hash_node_base *)0x0;
        (queue._M_h._M_single_bucket)->_M_nxt = queue._M_h._M_single_bucket + 6;
        queue._M_h._M_single_bucket[1]._M_nxt = (_Hash_node_base *)0x1;
        *(undefined4 *)&queue._M_h._M_single_bucket[4]._M_nxt = 0x3f800000;
        queue._M_h._M_single_bucket[5]._M_nxt = (_Hash_node_base *)0x0;
        queue._M_h._M_single_bucket[6]._M_nxt = (_Hash_node_base *)0x0;
      }
      else {
        (queue._M_h._M_single_bucket)->_M_nxt = queue._M_h._M_single_bucket + 6;
        queue._M_h._M_single_bucket[1]._M_nxt = (_Hash_node_base *)0x1;
        queue._M_h._M_single_bucket[2]._M_nxt = (_Hash_node_base *)0x0;
        queue._M_h._M_single_bucket[3]._M_nxt = (_Hash_node_base *)0x0;
        *(undefined4 *)&queue._M_h._M_single_bucket[4]._M_nxt = 0x3f800000;
        queue._M_h._M_single_bucket[5]._M_nxt = (_Hash_node_base *)0x0;
        queue._M_h._M_single_bucket[6]._M_nxt = (_Hash_node_base *)0x0;
        puVar39 = ((walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                    .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule)->
                  exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar13 = ((walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                    .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule)->
                  exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar39 != puVar13) {
          do {
            usedParams = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)CONCAT44(usedParams._4_4_,
                                     *(undefined4 *)
                                      &(puVar39->_M_t).
                                       super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                       .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
            local_a8 = (undefined1  [8])queue._M_h._M_single_bucket;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)queue._M_h._M_single_bucket,&usedParams,local_a8);
            puVar39 = (pointer)((long)&(puVar39->_M_t).
                                       super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                       .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl +
                               4);
          } while (puVar39 != puVar13);
        }
      }
      LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::~LivenessWalker
                ((LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_> *)auStack_3d8);
      return (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)queue._M_h._M_single_bucket;
    }
    p_Var7 = (_Hash_node_base *)
             (pBVar28->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar11 = *(long **)(walker.
                         super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                         _560_8_ +
                        ((ulong)p_Var7 %
                        (ulong)walker.
                               super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                               .liveBlocks._M_h._M_buckets) * 8);
    plVar22 = (long *)0x0;
    if ((plVar11 != (long *)0x0) &&
       (plVar30 = (long *)*plVar11, plVar22 = plVar11, p_Var7 != (_Hash_node_base *)plVar30[1])) {
      while (plVar11 = (long *)*plVar30,
            in_R8 = (__node_base_ptr)
                    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    liveBlocks._M_h._M_buckets, plVar11 != (long *)0x0) {
        plVar22 = (long *)0x0;
        if (((ulong)plVar11[1] %
             (ulong)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    liveBlocks._M_h._M_buckets !=
             (ulong)p_Var7 %
             (ulong)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    liveBlocks._M_h._M_buckets) ||
           (plVar22 = plVar30, plVar30 = plVar11, p_Var7 == (_Hash_node_base *)plVar11[1]))
        goto LAB_0077bb53;
      }
      plVar22 = (long *)0x0;
    }
LAB_0077bb53:
    if ((plVar22 != (long *)0x0) && (*plVar22 != 0)) {
      __bkt = (SetOfLocals *)((ulong)p_Var7 % (ulong)queue._M_h._M_buckets);
      pp_Var31 = *(__buckets_ptr *)((long)local_a8 + (long)__bkt * 8);
      p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
      live_00 = __bkt;
      if ((pp_Var31 != (__buckets_ptr)0x0) &&
         (p_Var21 = (__node_base_ptr)pp_Var31, p_Var38 = *pp_Var31, p_Var7 != (*pp_Var31)[1]._M_nxt)
         ) {
        while (in_R8 = p_Var38, p_Var38 = in_R8->_M_nxt, p_Var38 != (_Hash_node_base *)0x0) {
          live_00 = (SetOfLocals *)((ulong)p_Var38[1]._M_nxt % (ulong)queue._M_h._M_buckets);
          p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
          if ((live_00 != __bkt) || (p_Var21 = in_R8, p_Var7 == p_Var38[1]._M_nxt))
          goto LAB_0077bbc6;
        }
        p_Var21 = (__node_base_ptr)(__buckets_ptr)0x0;
      }
LAB_0077bbc6:
      if ((p_Var21 == (__node_base_ptr)0x0) || (p_Var21->_M_nxt == (__node_base_ptr)0x0)) {
        __node = (__node_ptr)operator_new(0x10);
        (__node->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
        *(_Hash_node_base **)
         (__node->
         super__Hash_node_value<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
         ).
         super__Hash_node_value_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>
         ._M_storage._M_storage.__data = p_Var7;
        std::
        _Hashtable<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_insert_unique_node
                  ((_Hashtable<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)local_a8,(size_type)__bkt,(__hash_code)p_Var7,__node,(size_type)in_R8);
        live_00 = extraout_RDX_01;
      }
      actions = (vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *)
                (pBVar28->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::scanLivenessThroughActions
                ((LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_> *)(actions + 2)
                 ,actions,live_00);
    }
    pBVar28 = (BasicBlock *)
              &(pBVar28->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

std::unordered_set<Index> getUsedParams(Function* func, Module* module) {
  // To find which params are used, compute liveness at the entry.
  // TODO: We could write bespoke code here rather than reuse LivenessWalker, as
  //       we only need liveness at the entry. The code below computes it for
  //       the param indexes in the entire function. However, there are usually
  //       very few params (compared to locals, which we ignore here), so this
  //       may be fast enough, and is very simple.
  struct ParamLiveness
    : public LivenessWalker<ParamLiveness, Visitor<ParamLiveness>> {
    using Super = LivenessWalker<ParamLiveness, Visitor<ParamLiveness>>;

    // Branches outside of the function can be ignored, as we only look at
    // locals, which vanish when we leave.
    bool ignoreBranchesOutsideOfFunc = true;

    // Ignore unreachable code and non-params.
    static void doVisitLocalGet(ParamLiveness* self, Expression** currp) {
      auto* get = (*currp)->cast<LocalGet>();
      if (self->currBasicBlock && self->getFunction()->isParam(get->index)) {
        Super::doVisitLocalGet(self, currp);
      }
    }
    static void doVisitLocalSet(ParamLiveness* self, Expression** currp) {
      auto* set = (*currp)->cast<LocalSet>();
      if (self->currBasicBlock && self->getFunction()->isParam(set->index)) {
        Super::doVisitLocalSet(self, currp);
      }
    }
  } walker;
  walker.setModule(module);
  walker.walkFunction(func);

  if (!walker.entry) {
    // Empty function: nothing is used.
    return {};
  }

  // We now have a sorted vector of the live params at the entry. Convert that
  // to a set.
  auto& sortedLiveness = walker.entry->contents.start;
  std::unordered_set<Index> usedParams;
  for (auto live : sortedLiveness) {
    usedParams.insert(live);
  }
  return usedParams;
}